

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

uint get_terminal_columns(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  curl_off_t num;
  char *p;
  undefined2 local_28;
  ushort uStack_26;
  undefined4 uStack_24;
  char *local_20;
  
  pcVar3 = (char *)curl_getenv();
  if (pcVar3 == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    local_20 = pcVar3;
    iVar1 = Curl_str_number(&local_20,(curl_off_t *)&local_28,10000);
    uVar4 = CONCAT22(uStack_26,local_28);
    if (CONCAT44(uStack_24,CONCAT22(uStack_26,local_28)) < 0x15) {
      uVar4 = 0;
    }
    if (iVar1 != 0) {
      uVar4 = 0;
    }
    curl_free();
  }
  if (uVar4 == 0) {
    iVar1 = ioctl(0,0x5413,&local_28);
    uVar4 = (uint)uStack_26;
    if (iVar1 != 0) {
      uVar4 = 0;
    }
    if (9999 < uVar4) {
      uVar4 = 0;
    }
  }
  uVar2 = 0x4f;
  if (uVar4 != 0) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

unsigned int get_terminal_columns(void)
{
  unsigned int width = 0;
  char *colp = curl_getenv("COLUMNS");
  if(colp) {
    curl_off_t num;
    const char *p = colp;
    if(!curlx_str_number(&p, &num, 10000) && (num > 20))
      width = (unsigned int)num;
    curl_free(colp);
  }

  if(!width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = (int)ts.ws_col;
#elif defined(_WIN32) && !defined(CURL_WINDOWS_UWP) && !defined(UNDER_CE)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    if(cols >= 0 && cols < 10000)
      width = (unsigned int)cols;
  }
  if(!width)
    width = 79;
  return width; /* 79 for unknown, might also be tiny or enormous */
}